

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

int ggml::cpu::aarch64::repack<block_iq4_nl,4l,4l>(ggml_tensor *t,void *data,size_t data_size)

{
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  undefined1 (*pauVar13) [64];
  undefined1 (*pauVar14) [64];
  int i;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  block_iq4_nlx4 out;
  block_iq4_nl dst_tmp [4];
  undefined8 local_c0;
  undefined1 auStack_b8 [56];
  undefined8 uStack_80;
  undefined8 local_78 [2];
  undefined2 auStack_68 [32];
  
  if (t->type == GGML_TYPE_IQ4_NL) {
    pauVar13 = (undefined1 (*) [64])t->data;
    puVar3 = (undefined8 *)ggml_nrows();
    uVar1 = t->ne[0];
    uVar7 = uVar1 + 0x1f;
    if (-1 < (long)uVar1) {
      uVar7 = uVar1;
    }
    iVar2 = (int)puVar3;
    iVar6 = (int)((long)uVar7 >> 5);
    if ((long)(iVar2 * iVar6) * 0x12 == data_size) {
      iVar9 = -1;
      if ((uVar1 & 7) == 0 && (t->ne[1] & 3U) == 0) {
        if (0 < iVar2) {
          puVar4 = (undefined8 *)(long)iVar6;
          auVar18 = vpbroadcastq_avx512f();
          vpaddq_avx512f(auVar18,_DAT_0014b240);
          vpaddq_avx512f(auVar18,_DAT_0014b280);
          iVar9 = 0;
          do {
            if (0 < (long)puVar4) {
              puVar11 = (undefined8 *)0x0;
              puVar10 = (undefined8 *)data;
              pauVar14 = pauVar13;
              do {
                lVar15 = 0;
                puVar12 = puVar10;
                do {
                  *(undefined2 *)((long)auStack_68 + lVar15) = *(undefined2 *)(puVar12 + 2);
                  uVar8 = puVar12[1];
                  *(undefined8 *)((long)local_78 + lVar15) = *puVar12;
                  *(undefined8 *)((long)local_78 + lVar15 + 8) = uVar8;
                  lVar15 = lVar15 + 0x12;
                  puVar12 = (undefined8 *)((long)puVar12 + (long)puVar4 * 0x12);
                } while (lVar15 != 0x48);
                lVar15 = 0;
                puVar12 = local_78;
                do {
                  *(undefined2 *)(auStack_b8 + lVar15 * 2 + -8) = *(undefined2 *)puVar12;
                  lVar15 = lVar15 + 1;
                  puVar12 = (undefined8 *)((long)puVar12 + 0x12);
                } while (lVar15 != 4);
                auVar16 = vpgatherqd_avx512f(*puVar3);
                auVar17 = vpgatherqd_avx512f(*puVar4);
                auVar18 = vinserti64x4_avx512f(ZEXT3264(auVar17),auVar16,1);
                auVar18 = vmovdqu64_avx512f(auVar18);
                auStack_b8 = auVar18._0_56_;
                uStack_80 = auVar18._56_8_;
                pauVar13 = (undefined1 (*) [64])(pauVar14[1] + 8);
                *(undefined8 *)pauVar14[1] = uStack_80;
                auVar18._8_56_ = auStack_b8;
                auVar18._0_8_ = local_c0;
                auVar18 = vmovdqu64_avx512f(auVar18);
                auVar18 = vmovdqu64_avx512f(auVar18);
                *pauVar14 = auVar18;
                puVar11 = (undefined8 *)((long)puVar11 + 1);
                puVar10 = (undefined8 *)((long)puVar10 + 0x12);
                pauVar14 = pauVar13;
              } while (puVar11 != puVar4);
            }
            iVar9 = iVar9 + 4;
            data = (void *)((long)data + (long)(iVar6 * 4) * 0x12);
          } while (iVar9 < iVar2);
        }
        iVar9 = 0;
      }
      return iVar9;
    }
    pcVar5 = "data_size == nrow * nblocks * sizeof(block_iq4_nl)";
    uVar8 = 0x172e;
  }
  else {
    pcVar5 = "t->type == GGML_TYPE_IQ4_NL";
    uVar8 = 0x1723;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

static int repack_iq4_nl_to_iq4_nl_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_IQ4_NL);
    //GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    GGML_ASSERT(interleave_block == 4);

    block_iq4_nlx4 * dst = (block_iq4_nlx4 *)t->data;
    const block_iq4_nl * src = (const block_iq4_nl *)data;
    block_iq4_nl dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nrows_interleaved = 4;
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_iq4_nl));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_iq4_nlx4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}